

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall
cmTarget::GetMappedConfig
          (cmTarget *this,string *desired_config,char **loc,char **imp,string *suffix)

{
  bool bVar1;
  TargetType TVar2;
  char *pcVar3;
  reference pbVar4;
  bool local_389;
  bool local_302;
  allocator local_2d1;
  undefined1 local_2d0 [8];
  string impProp_2;
  undefined1 local_2a8 [8];
  string locProp_2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_268;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_260;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_258;
  const_iterator aci;
  string local_248;
  allocator local_221;
  string local_220;
  char *local_200;
  char *iconfigs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  availableConfigs;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  undefined1 local_188 [8];
  string impProp_1;
  undefined1 local_160 [8];
  string locProp_1;
  undefined1 local_138 [8];
  string impProp;
  undefined1 local_110 [8];
  string locProp;
  string mcUpper;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  const_iterator mci;
  undefined1 local_b0 [6];
  bool allowImp;
  char *local_90;
  char *mapValue;
  allocator local_71;
  undefined1 local_70 [8];
  string mapProp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mappedConfigs;
  string *suffix_local;
  char **imp_local;
  char **loc_local;
  string *desired_config_local;
  cmTarget *this_local;
  
  TVar2 = GetType(this);
  if (TVar2 == INTERFACE_LIBRARY) {
    this_local._7_1_ = true;
  }
  else {
    std::__cxx11::string::operator=((string *)suffix,"_");
    std::__cxx11::string::operator+=((string *)suffix,(string *)desired_config);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&mapProp.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_70,"MAP_IMPORTED_CONFIG_",&local_71);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::operator+=((string *)local_70,(string *)desired_config);
    pcVar3 = GetProperty(this,(string *)local_70);
    local_90 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_b0,pcVar3,(allocator *)((long)&mci._M_current + 7));
      cmSystemTools::ExpandListArgument
                ((string *)local_b0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&mapProp.field_2 + 8),false);
      std::__cxx11::string::~string((string *)local_b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&mci._M_current + 7));
    }
    std::__cxx11::string::~string((string *)local_70);
    mci._M_current._6_1_ = HasImportLibrary(this);
    local_c8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&mapProp.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_c0,&local_c8);
    while( true ) {
      local_302 = false;
      if ((*loc == (char *)0x0) && (local_302 = false, *imp == (char *)0x0)) {
        mcUpper.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&mapProp.field_2 + 8));
        local_302 = __gnu_cxx::operator!=
                              (&local_c0,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&mcUpper.field_2 + 8));
      }
      if (local_302 == false) break;
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_c0);
      cmsys::SystemTools::UpperCase((string *)((long)&locProp.field_2 + 8),pbVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_110,"IMPORTED_LOCATION_",
                 (allocator *)(impProp.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(impProp.field_2._M_local_buf + 0xf));
      std::__cxx11::string::operator+=
                ((string *)local_110,(string *)(locProp.field_2._M_local_buf + 8));
      pcVar3 = GetProperty(this,(string *)local_110);
      *loc = pcVar3;
      if ((mci._M_current._6_1_ & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_138,"IMPORTED_IMPLIB_",
                   (allocator *)(locProp_1.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(locProp_1.field_2._M_local_buf + 0xf));
        std::__cxx11::string::operator+=
                  ((string *)local_138,(string *)(locProp.field_2._M_local_buf + 8));
        pcVar3 = GetProperty(this,(string *)local_138);
        *imp = pcVar3;
        std::__cxx11::string::~string((string *)local_138);
      }
      if ((*loc != (char *)0x0) || (*imp != (char *)0x0)) {
        std::__cxx11::string::operator=((string *)suffix,"_");
        std::__cxx11::string::operator+=
                  ((string *)suffix,(string *)(locProp.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::~string((string *)(locProp.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_c0);
    }
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&mapProp.field_2 + 8));
    if (((bVar1) || (*loc != (char *)0x0)) || (*imp != (char *)0x0)) {
      if ((*loc == (char *)0x0) && (*imp == (char *)0x0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_160,"IMPORTED_LOCATION",
                   (allocator *)(impProp_1.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(impProp_1.field_2._M_local_buf + 0xf));
        std::__cxx11::string::operator+=((string *)local_160,(string *)suffix);
        pcVar3 = GetProperty(this,(string *)local_160);
        *loc = pcVar3;
        if ((mci._M_current._6_1_ & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_188,"IMPORTED_IMPLIB",&local_189);
          std::allocator<char>::~allocator((allocator<char> *)&local_189);
          std::__cxx11::string::operator+=((string *)local_188,(string *)suffix);
          pcVar3 = GetProperty(this,(string *)local_188);
          *imp = pcVar3;
          std::__cxx11::string::~string((string *)local_188);
        }
        std::__cxx11::string::~string((string *)local_160);
      }
      if ((*loc == (char *)0x0) && (*imp == (char *)0x0)) {
        std::__cxx11::string::operator=((string *)suffix,"");
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1b0,"IMPORTED_LOCATION",&local_1b1);
        pcVar3 = GetProperty(this,&local_1b0);
        *loc = pcVar3;
        std::__cxx11::string::~string((string *)&local_1b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
        if ((mci._M_current._6_1_ & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1d8,"IMPORTED_IMPLIB",
                     (allocator *)
                     ((long)&availableConfigs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          pcVar3 = GetProperty(this,&local_1d8);
          *imp = pcVar3;
          std::__cxx11::string::~string((string *)&local_1d8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&availableConfigs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        }
      }
      if ((*loc == (char *)0x0) && (*imp == (char *)0x0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&iconfigs);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_220,"IMPORTED_CONFIGURATIONS",&local_221);
        pcVar3 = GetProperty(this,&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator((allocator<char> *)&local_221);
        local_200 = pcVar3;
        if (pcVar3 != (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_248,pcVar3,(allocator *)((long)&aci._M_current + 7));
          cmSystemTools::ExpandListArgument
                    (&local_248,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&iconfigs,false);
          std::__cxx11::string::~string((string *)&local_248);
          std::allocator<char>::~allocator((allocator<char> *)((long)&aci._M_current + 7));
        }
        local_260._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&iconfigs);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_258,&local_260);
        while( true ) {
          local_389 = false;
          if ((*loc == (char *)0x0) && (local_389 = false, *imp == (char *)0x0)) {
            local_268._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&iconfigs);
            local_389 = __gnu_cxx::operator!=(&local_258,&local_268);
          }
          if (local_389 == false) break;
          std::__cxx11::string::operator=((string *)suffix,"_");
          pbVar4 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_258);
          cmsys::SystemTools::UpperCase((string *)((long)&locProp_2.field_2 + 8),pbVar4);
          std::__cxx11::string::operator+=
                    ((string *)suffix,(string *)(locProp_2.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(locProp_2.field_2._M_local_buf + 8));
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_2a8,"IMPORTED_LOCATION",
                     (allocator *)(impProp_2.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator
                    ((allocator<char> *)(impProp_2.field_2._M_local_buf + 0xf));
          std::__cxx11::string::operator+=((string *)local_2a8,(string *)suffix);
          pcVar3 = GetProperty(this,(string *)local_2a8);
          *loc = pcVar3;
          if ((mci._M_current._6_1_ & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)local_2d0,"IMPORTED_IMPLIB",&local_2d1);
            std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
            std::__cxx11::string::operator+=((string *)local_2d0,(string *)suffix);
            pcVar3 = GetProperty(this,(string *)local_2d0);
            *imp = pcVar3;
            std::__cxx11::string::~string((string *)local_2d0);
          }
          std::__cxx11::string::~string((string *)local_2a8);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_258);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&iconfigs);
      }
      if ((*loc == (char *)0x0) && (*imp == (char *)0x0)) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    locProp_1.field_2._8_4_ = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&mapProp.field_2 + 8));
  }
  return this_local._7_1_;
}

Assistant:

bool cmTarget::GetMappedConfig(std::string const& desired_config,
                               const char** loc,
                               const char** imp,
                               std::string& suffix) const
{
  if (this->GetType() == cmState::INTERFACE_LIBRARY)
    {
    // This method attempts to find a config-specific LOCATION for the
    // IMPORTED library. In the case of cmState::INTERFACE_LIBRARY, there is no
    // LOCATION at all, so leaving *loc and *imp unchanged is the appropriate
    // and valid response.
    return true;
    }

  // Track the configuration-specific property suffix.
  suffix = "_";
  suffix += desired_config;

  std::vector<std::string> mappedConfigs;
  {
  std::string mapProp = "MAP_IMPORTED_CONFIG_";
  mapProp += desired_config;
  if(const char* mapValue = this->GetProperty(mapProp))
    {
    cmSystemTools::ExpandListArgument(mapValue, mappedConfigs);
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // On a DLL platform there may be only IMPORTED_IMPLIB for a shared
  // library or an executable with exports.
  bool allowImp = this->HasImportLibrary();

  // If a mapping was found, check its configurations.
  for(std::vector<std::string>::const_iterator mci = mappedConfigs.begin();
      !*loc && !*imp && mci != mappedConfigs.end(); ++mci)
    {
    // Look for this configuration.
    std::string mcUpper = cmSystemTools::UpperCase(*mci);
    std::string locProp = "IMPORTED_LOCATION_";
    locProp += mcUpper;
    *loc = this->GetProperty(locProp);
    if(allowImp)
      {
      std::string impProp = "IMPORTED_IMPLIB_";
      impProp += mcUpper;
      *imp = this->GetProperty(impProp);
      }

    // If it was found, use it for all properties below.
    if(*loc || *imp)
      {
      suffix = "_";
      suffix += mcUpper;
      }
    }

  // If we needed to find one of the mapped configurations but did not
  // then the target is not found.  The project does not want any
  // other configuration.
  if(!mappedConfigs.empty() && !*loc && !*imp)
    {
    return false;
    }

  // If we have not yet found it then there are no mapped
  // configurations.  Look for an exact-match.
  if(!*loc && !*imp)
    {
    std::string locProp = "IMPORTED_LOCATION";
    locProp += suffix;
    *loc = this->GetProperty(locProp);
    if(allowImp)
      {
      std::string impProp = "IMPORTED_IMPLIB";
      impProp += suffix;
      *imp = this->GetProperty(impProp);
      }
    }

  // If we have not yet found it then there are no mapped
  // configurations and no exact match.
  if(!*loc && !*imp)
    {
    // The suffix computed above is not useful.
    suffix = "";

    // Look for a configuration-less location.  This may be set by
    // manually-written code.
    *loc = this->GetProperty("IMPORTED_LOCATION");
    if(allowImp)
      {
      *imp = this->GetProperty("IMPORTED_IMPLIB");
      }
    }

  // If we have not yet found it then the project is willing to try
  // any available configuration.
  if(!*loc && !*imp)
    {
    std::vector<std::string> availableConfigs;
    if(const char* iconfigs = this->GetProperty("IMPORTED_CONFIGURATIONS"))
      {
      cmSystemTools::ExpandListArgument(iconfigs, availableConfigs);
      }
    for(std::vector<std::string>::const_iterator
          aci = availableConfigs.begin();
        !*loc && !*imp && aci != availableConfigs.end(); ++aci)
      {
      suffix = "_";
      suffix += cmSystemTools::UpperCase(*aci);
      std::string locProp = "IMPORTED_LOCATION";
      locProp += suffix;
      *loc = this->GetProperty(locProp);
      if(allowImp)
        {
        std::string impProp = "IMPORTED_IMPLIB";
        impProp += suffix;
        *imp = this->GetProperty(impProp);
        }
      }
    }
  // If we have not yet found it then the target is not available.
  if(!*loc && !*imp)
    {
    return false;
    }

  return true;
}